

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bboptions.c
# Opt level: O0

int bb_options_get(bb_options_t *options,int argc,char **argv)

{
  int iVar1;
  int local_3c;
  undefined4 local_38;
  int local_34;
  int option_index;
  int this_option_optind;
  int digit_optind;
  int c;
  char **argv_local;
  bb_options_t *pbStack_18;
  int argc_local;
  bb_options_t *options_local;
  
  option_index = 0;
  options->no_suppliers = 1;
  options->no_consumers = 1;
  options->supplier_max_delay_ms = 300;
  options->consumer_max_delay_ms = 1000;
  options->gen_count = 2000;
  options->bsize = 100;
  _digit_optind = argv;
  argv_local._4_4_ = argc;
  pbStack_18 = options;
  while( true ) {
    if (_optind == 0) {
      local_3c = 1;
    }
    else {
      local_3c = _optind;
    }
    local_34 = local_3c;
    local_38 = 0;
    this_option_optind =
         getopt_long(argv_local._4_4_,_digit_optind,"",bb_options_get::long_options,&local_38);
    if (this_option_optind == 0xffffffff) break;
    switch(this_option_optind) {
    case 0x3f:
      break;
    default:
      printf("?? getopt returned character code 0%o ??\n",(ulong)(uint)this_option_optind);
      break;
    case 0x62:
      iVar1 = atoi(_optarg);
      pbStack_18->bsize = iVar1;
      break;
    case 99:
      iVar1 = atoi(_optarg);
      pbStack_18->no_consumers = iVar1;
      break;
    case 0x67:
      iVar1 = atoi(_optarg);
      pbStack_18->gen_count = iVar1;
      break;
    case 0x68:
      fprintf(_stderr,
              "usage: %s [--suppliers SUPPLIERS] [--consumers CONSUMERS] [--sdelay SDELAY] [--cdelay CDELAY]  [--gen GEN]  [--bsize BSIZE]\n"
              ,*_digit_optind);
      fprintf(_stderr,"\tSUPPLIERS is number of suppliers (default:  %d)\n",1);
      fprintf(_stderr,"\tCONSUMERS is number of suppliers (default:  %d)\n",1);
      fprintf(_stderr,"\tSDELAY is max random delay in millisconds (default: %d)\n",300);
      fprintf(_stderr,"\tCDELAY is max random delay in millisconds (default: %d)\n",1000);
      fprintf(_stderr,"\tBSIZE is bounded buffer size (default: %d)\n",100);
      fprintf(_stderr,"\tGEN number of messages to generate per supplier (default: %d)\n",2000);
      exit(0);
    case 0x73:
      iVar1 = atoi(_optarg);
      pbStack_18->no_suppliers = iVar1;
      break;
    case 0x78:
      iVar1 = atoi(_optarg);
      pbStack_18->supplier_max_delay_ms = iVar1;
      break;
    case 0x79:
      iVar1 = atoi(_optarg);
      pbStack_18->consumer_max_delay_ms = iVar1;
    }
  }
  return options_local._4_4_;
}

Assistant:

int bb_options_get(bb_options_t* options, int argc, char **argv)
{
    int c;
    int digit_optind = 0;

    options->no_suppliers = NUM_SUPPLIERS;
    options->no_consumers = NUM_CONSUMERS;
    options->supplier_max_delay_ms = SUPPLIER_DELAY;
    options->consumer_max_delay_ms = CONSUMER_DELAY;
    options->gen_count = GEN_COUNT;
    options->bsize = BB_SIZE;

    while (1)
    {
        int this_option_optind = optind ? optind : 1;
        int option_index = 0;
        static struct option long_options[] =
        {
            {"suppliers", required_argument, 0, 's' },
            {"consumers", required_argument, 0, 'c' },
            {"sdelay",    required_argument, 0, 'x' },
            {"cdelay",    required_argument, 0, 'y' },
            {"gen",       required_argument, 0, 'g' },
            {"bsize",     required_argument, 0, 'b' },
            {"help",     no_argument, 0, 'h' },
            {0,         0,                 0,  0 }
        };

        c = getopt_long(argc, argv, "",
                        long_options, &option_index);
        if (c == -1)
            break;

        switch (c)
        {
        case 'b':
            options->bsize = atoi(optarg);
            break;

        case 's':
            options->no_suppliers = atoi(optarg);
            break;

        case 'c':
            options->no_consumers = atoi(optarg);
            break;

        case 'x':
            options->supplier_max_delay_ms = atoi(optarg);
            break;

        case 'y':
            options->consumer_max_delay_ms = atoi(optarg);
            break;

        case 'g':
            options->gen_count = atoi(optarg);
            break;

        case 'h':
            fprintf(stderr, "usage: %s [--suppliers SUPPLIERS] [--consumers CONSUMERS] [--sdelay SDELAY] [--cdelay CDELAY]  [--gen GEN]  [--bsize BSIZE]\n", argv[0]);
            fprintf(stderr, "\tSUPPLIERS is number of suppliers (default:  %d)\n", NUM_SUPPLIERS);
            fprintf(stderr, "\tCONSUMERS is number of suppliers (default:  %d)\n", NUM_CONSUMERS);
            fprintf(stderr, "\tSDELAY is max random delay in millisconds (default: %d)\n", SUPPLIER_DELAY);
            fprintf(stderr, "\tCDELAY is max random delay in millisconds (default: %d)\n", CONSUMER_DELAY);
            fprintf(stderr, "\tBSIZE is bounded buffer size (default: %d)\n", BB_SIZE);
            fprintf(stderr, "\tGEN number of messages to generate per supplier (default: %d)\n", GEN_COUNT);
            exit(0);
            break;

        case '?':
            break;

        default:
            printf("?? getopt returned character code 0%o ??\n", c);
        }
    }

    /*
     * Save these notes from GNU man page.
    if (optind < argc) {
      printf("non-option ARGV-elements: ");
      while (optind < argc)
        printf("%s ", argv[optind++]);
      printf("\n");
    }
    */

}